

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O0

string * __thiscall fasttext::Args::lossToString_abi_cxx11_(Args *this,loss_name ln)

{
  allocator<char> *__a;
  int in_EDX;
  string *in_RDI;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  allocator<char> local_15 [21];
  
  __a = (allocator<char> *)(ulong)(in_EDX - 1);
  switch(__a) {
  case (allocator<char> *)0x0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,__a);
    std::allocator<char>::~allocator(local_15);
    break;
  case (allocator<char> *)0x1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,__a);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffdb);
    break;
  case (allocator<char> *)0x2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,__a);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffda);
    break;
  case (allocator<char> *)0x3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,__a);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd9);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,__a);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd8);
  }
  return in_RDI;
}

Assistant:

std::string Args::lossToString(loss_name ln) const {
  switch (ln) {
    case loss_name::hs:
      return "hs";
    case loss_name::ns:
      return "ns";
    case loss_name::softmax:
      return "softmax";
    case loss_name::ova:
      return "one-vs-all";
  }
  return "Unknown loss!"; // should never happen
}